

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_joystick_events.c
# Opt level: O0

void setup_joystick_values(ALLEGRO_JOYSTICK *joy)

{
  int iVar1;
  long in_RDI;
  int j;
  int i;
  ALLEGRO_JOYSTICK_STATE jst;
  int local_150;
  int local_14c;
  float local_148 [48];
  int aiStack_88 [32];
  long local_8;
  
  if (in_RDI == 0) {
    num_sticks = 0;
    num_buttons = 0;
  }
  else {
    local_8 = in_RDI;
    al_get_joystick_state(in_RDI,local_148);
    num_sticks = al_get_joystick_num_sticks(local_8);
    if (0x10 < num_sticks) {
      num_sticks = 0x10;
    }
    for (local_14c = 0; local_14c < num_sticks; local_14c = local_14c + 1) {
      iVar1 = al_get_joystick_num_axes(local_8,local_14c);
      num_axes[local_14c] = iVar1;
      for (local_150 = 0; local_150 < num_axes[local_14c]; local_150 = local_150 + 1) {
        joys[local_14c][local_150] = local_148[(long)local_14c * 3 + (long)local_150];
      }
    }
    num_buttons = al_get_joystick_num_buttons(local_8);
    if (0x20 < num_buttons) {
      num_buttons = 0x20;
    }
    for (local_14c = 0; local_14c < num_buttons; local_14c = local_14c + 1) {
      joys_buttons[local_14c] = 0x3fff < aiStack_88[local_14c];
    }
  }
  return;
}

Assistant:

static void setup_joystick_values(ALLEGRO_JOYSTICK *joy)
{
   ALLEGRO_JOYSTICK_STATE jst;
   int i, j;

   if (joy == NULL) {
      num_sticks = 0;
      num_buttons = 0;
      return;
   }

   al_get_joystick_state(joy, &jst);

   num_sticks = al_get_joystick_num_sticks(joy);
   if (num_sticks > MAX_STICKS)
      num_sticks = MAX_STICKS;
   for (i = 0; i < num_sticks; i++) {
      num_axes[i] = al_get_joystick_num_axes(joy, i);
      for (j = 0; j < num_axes[i]; ++j)
         joys[i][j] = jst.stick[i].axis[j];
   }

   num_buttons = al_get_joystick_num_buttons(joy);
   if (num_buttons > MAX_BUTTONS) {
      num_buttons = MAX_BUTTONS;
   }
   for (i = 0; i < num_buttons; i++) {
      joys_buttons[i] = (jst.button[i] >= 16384);
   }
}